

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_aggregate_function.cpp
# Opt level: O1

void __thiscall
duckdb::WindowAggregateExecutorLocalState::WindowAggregateExecutorLocalState
          (WindowAggregateExecutorLocalState *this,WindowExecutorGlobalState *gstate,
          WindowAggregator *aggregator)

{
  _Head_base<0UL,_duckdb::WindowAggregatorState_*,_false> _Var1;
  _Head_base<0UL,_duckdb::WindowAggregatorState_*,_false> _Var2;
  WindowAggregatorState *in_RAX;
  type pWVar3;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::WindowAggregatorState_*,_false> local_28;
  
  local_28._M_head_impl = in_RAX;
  WindowExecutorBoundsState::WindowExecutorBoundsState
            (&this->super_WindowExecutorBoundsState,gstate);
  (this->super_WindowExecutorBoundsState).super_WindowExecutorLocalState.super_WindowExecutorState.
  _vptr_WindowExecutorState = (_func_int **)&PTR__WindowAggregateExecutorLocalState_019cc748;
  (this->aggregator_state).
  super_unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowAggregatorState_*,_std::default_delete<duckdb::WindowAggregatorState>_>
  .super__Head_base<0UL,_duckdb::WindowAggregatorState_*,_false>._M_head_impl =
       (WindowAggregatorState *)0x0;
  ExpressionExecutor::ExpressionExecutor(&this->filter_executor,gstate->executor->context);
  (this->filter_sel).sel_vector = (sel_t *)0x0;
  (this->filter_sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->filter_sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pWVar3 = unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
           ::operator*((unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
                        *)(gstate + 1));
  (*aggregator->_vptr_WindowAggregator[3])(&local_28,aggregator,pWVar3);
  _Var2._M_head_impl = local_28._M_head_impl;
  local_28._M_head_impl = (WindowAggregatorState *)0x0;
  _Var1._M_head_impl =
       (this->aggregator_state).
       super_unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::WindowAggregatorState_*,_std::default_delete<duckdb::WindowAggregatorState>_>
       .super__Head_base<0UL,_duckdb::WindowAggregatorState_*,_false>._M_head_impl;
  (this->aggregator_state).
  super_unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowAggregatorState_*,_std::default_delete<duckdb::WindowAggregatorState>_>
  .super__Head_base<0UL,_duckdb::WindowAggregatorState_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (WindowAggregatorState *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_WindowAggregatorState + 8))();
  }
  if (local_28._M_head_impl != (WindowAggregatorState *)0x0) {
    (*(local_28._M_head_impl)->_vptr_WindowAggregatorState[1])();
  }
  if ((Expression *)gstate[1].executor != (Expression *)0x0) {
    ExpressionExecutor::AddExpression(&this->filter_executor,(Expression *)gstate[1].executor);
    SelectionVector::Initialize(&this->filter_sel,0x800);
  }
  return;
}

Assistant:

WindowAggregateExecutorLocalState(const WindowExecutorGlobalState &gstate, const WindowAggregator &aggregator)
	    : WindowExecutorBoundsState(gstate), filter_executor(gstate.executor.context) {

		auto &gastate = gstate.Cast<WindowAggregateExecutorGlobalState>();
		aggregator_state = aggregator.GetLocalState(*gastate.gsink);

		// evaluate the FILTER clause and stuff it into a large mask for compactness and reuse
		auto filter_ref = gastate.filter_ref;
		if (filter_ref) {
			filter_executor.AddExpression(*filter_ref);
			filter_sel.Initialize(STANDARD_VECTOR_SIZE);
		}
	}